

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_handle.c
# Opt level: O2

log_record log_handle_push(log_handle handle,log_record_ctor record_ctor)

{
  log_record __src;
  size_t __size;
  log_record plVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = handle->count;
  if (sVar2 + 1 == handle->size) {
    __size = (sVar2 + 1) * 2;
    plVar1 = (log_record)realloc(handle->buffer,__size);
    if (plVar1 == (log_record)0x0) {
      return (log_record)0x0;
    }
    handle->buffer = plVar1;
    handle->size = __size;
    sVar2 = handle->count;
  }
  if (sVar2 == 0) {
    sVar2 = 1;
  }
  else {
    plVar1 = handle->buffer;
    sVar2 = log_record_size();
    __src = handle->buffer;
    sVar3 = log_record_size();
    memmove((void *)((long)&plVar1->time + sVar2),__src,sVar3 * handle->count);
    sVar2 = handle->count + 1;
  }
  handle->count = sVar2;
  plVar1 = log_handle_set(handle,0,record_ctor);
  return plVar1;
}

Assistant:

log_record log_handle_push(log_handle handle, const log_record_ctor record_ctor)
{
	if ((handle->count + 1) == handle->size)
	{
		const size_t new_size = handle->size << 0x01;

		register void *buffer = realloc(handle->buffer, new_size);

		if (buffer == NULL)
		{
			return NULL;
		}

		handle->buffer = buffer;

		handle->size = new_size;
	}

	if (handle->count > 0)
	{
		void *dest = (unsigned char *)(handle->buffer) + log_record_size();

		memmove(dest, handle->buffer, log_record_size() * handle->count);
	}

	++handle->count;

	return log_handle_set(handle, 0, record_ctor);
}